

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_iter.cpp
# Opt level: O0

void __thiscall
ON_SubDFaceIterator::Internal_Init
          (ON_SubDFaceIterator *this,ON_SubDRef *subd_ref,uint face_count,ON_SubDFace *first,
          ON_SubDFace *last,ON_SubDComponentPtr component_ptr)

{
  Type TVar1;
  ON_SubDComponentPtr *local_48;
  ON_SubDFace *last_local;
  ON_SubDFace *first_local;
  uint face_count_local;
  ON_SubDRef *subd_ref_local;
  ON_SubDFaceIterator *this_local;
  ON_SubDComponentPtr component_ptr_local;
  
  this_local = (ON_SubDFaceIterator *)component_ptr.m_ptr;
  ON_SubDRef::operator=(&this->m_subd_ref,subd_ref);
  if (((first != (ON_SubDFace *)0x0) && (last != (ON_SubDFace *)0x0)) && (face_count != 0)) {
    this->m_face_first = first;
    this->m_face_last = last;
    this->m_face_current = this->m_face_first;
    this->m_face_count = face_count;
    TVar1 = ON_SubDComponentPtr::ComponentType((ON_SubDComponentPtr *)&this_local);
    if (TVar1 == Unset) {
      local_48 = &ON_SubDComponentPtr::Null;
    }
    else {
      local_48 = (ON_SubDComponentPtr *)&this_local;
    }
    (this->m_component_ptr).m_ptr = (ON__UINT_PTR)local_48->m_ptr;
  }
  return;
}

Assistant:

void ON_SubDFaceIterator::Internal_Init(
  const ON_SubDRef& subd_ref,
  unsigned int face_count,
  const ON_SubDFace* first,
  const ON_SubDFace* last,
  ON_SubDComponentPtr component_ptr
)
{
  m_subd_ref = subd_ref;
  if (nullptr != first && nullptr != last && face_count > 0)
  {
    m_face_first = first;
    m_face_last = last;
    m_face_current = m_face_first;
    m_face_count = face_count;
    m_component_ptr
      = (ON_SubDComponentPtr::Type::Unset == component_ptr.ComponentType())
      ? ON_SubDComponentPtr::Null
      : component_ptr;
  }
}